

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ushort uVar3;
  pointer paVar4;
  function_record *pfVar5;
  bool bVar6;
  uint __val;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  long *plVar13;
  undefined8 *puVar14;
  type_info *ptVar15;
  detail *pdVar16;
  function_record *pfVar17;
  function_record *pfVar18;
  PyMethodDef *pPVar19;
  object *poVar20;
  PyObject *pPVar21;
  PyObject *pPVar22;
  descrgetfunc p_Var23;
  error_already_set *this_00;
  ushort uVar24;
  PyTypeObject *pPVar25;
  ulong *puVar26;
  size_type *psVar27;
  ulong uVar28;
  long *plVar29;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  char cVar30;
  undefined8 uVar31;
  PySequenceMethods *pPVar32;
  pointer paVar33;
  long lVar34;
  cpp_function *pcVar35;
  uint __len;
  hashfunc p_Var36;
  uint uVar37;
  ulong uVar38;
  function_record *pfVar39;
  undefined1 auVar40 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  undefined1 local_1d0 [16];
  char *local_1c0;
  undefined1 auStack_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  function_record *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [32];
  hashfunc local_148;
  undefined1 local_140 [39];
  allocator<char> local_119;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  type_info **local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [16];
  char *local_c0;
  object local_b8;
  descrgetfunc local_b0;
  cpp_function *local_a8;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_a0;
  str local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar11 = "";
  if (rec->name != (char *)0x0) {
    pcVar11 = rec->name;
  }
  local_148 = (hashfunc)args;
  local_f8 = types;
  local_a8 = this;
  pcVar11 = strdup(pcVar11);
  rec->name = pcVar11;
  if (rec->doc != (char *)0x0) {
    pcVar12 = strdup(rec->doc);
    rec->doc = pcVar12;
  }
  paVar33 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_190 = rec;
  if (paVar33 != paVar4) {
    do {
      if (*(char **)paVar33 != (char *)0x0) {
        pcVar11 = strdup(*(char **)paVar33);
        *(char **)paVar33 = pcVar11;
      }
      if (*(char **)(paVar33 + 8) == (char *)0x0) {
        if (*(long *)(paVar33 + 0x10) != 0) {
          auVar40 = PyObject_Repr();
          if (auVar40._0_8_ == (pointer)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_f0._M_dataplus._M_p = auVar40._0_8_;
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_1d0,(pybind11 *)&local_f0,auVar40._8_8_);
          uVar31 = local_1d0._0_8_;
          pcVar11 = strdup((char *)local_1d0._0_8_);
          *(char **)(paVar33 + 8) = pcVar11;
          if ((PyTypeObject *)uVar31 != (PyTypeObject *)&local_1c0) {
            operator_delete((void *)uVar31,(ulong)((long)local_1c0 + 1));
          }
          object::~object((object *)&local_f0);
        }
      }
      else {
        pcVar11 = strdup(*(char **)(paVar33 + 8));
        *(char **)(paVar33 + 8) = pcVar11;
      }
      paVar33 = paVar33 + 0x20;
    } while (paVar33 != paVar4);
    pcVar11 = local_190->name;
  }
  pfVar39 = local_190;
  iVar9 = strcmp(pcVar11,"__init__");
  if (iVar9 == 0) {
    uVar24 = 1;
  }
  else {
    iVar9 = strcmp(pcVar11,"__setstate__");
    uVar24 = (ushort)(iVar9 == 0);
  }
  uVar3 = *(ushort *)&pfVar39->field_0x59;
  *(ushort *)&pfVar39->field_0x59 = uVar3 & 0xfffe | uVar24;
  if (((uVar3 & 2) == 0 & (byte)uVar24) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,(char *)(pfVar39->scope).m_ptr[1].ob_type,
               (allocator<char> *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,pfVar39->name,(allocator<char> *)&local_1b0);
    uVar31 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    plVar13 = (long *)std::__cxx11::string::append(local_118);
    pPVar25 = (PyTypeObject *)(plVar13 + 2);
    if ((PyTypeObject *)*plVar13 == pPVar25) {
      local_168._16_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
      local_168._24_8_ = plVar13[3];
      local_168._0_8_ = (PyObject *)(local_168 + 0x10);
    }
    else {
      local_168._16_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
      local_168._0_8_ = (PyObject *)*plVar13;
    }
    local_168._8_8_ = plVar13[1];
    *plVar13 = (long)pPVar25;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append(local_168,(ulong)local_f0._M_dataplus._M_p);
    puVar26 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_188.field_2._M_allocated_capacity = *puVar26;
      local_188.field_2._8_8_ = plVar13[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar26;
      local_188._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_188._M_string_length = plVar13[1];
    *plVar13 = (long)puVar26;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    psVar27 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar27) {
      local_1b0.field_2._M_allocated_capacity = *psVar27;
      local_1b0.field_2._8_8_ = puVar14[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar27;
      local_1b0._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_1b0._M_string_length = puVar14[1];
    *puVar14 = psVar27;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    PyErr_WarnEx(uVar31,local_1b0._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      (ulong)(local_188.field_2._M_allocated_capacity + 1));
    }
    if ((PyObject *)local_168._0_8_ != (PyObject *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    pfVar39 = local_190;
    if ((undefined1 *)local_118._0_8_ != local_108) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
    }
  }
  local_a0 = &pfVar39->args;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_b0 = (descrgetfunc)&local_1c0;
  p_Var36 = (hashfunc)0x0;
  lVar34 = 0;
  do {
    bVar2 = *text;
    if (bVar2 < 0x7b) {
      if (bVar2 == 0x25) {
        pPVar25 = (PyTypeObject *)local_f8[lVar34];
        if (pPVar25 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1d0._0_8_ = pPVar25;
        ptVar15 = detail::get_type_info((type_index *)local_1d0,false);
        pfVar39 = local_190;
        lVar34 = lVar34 + 1;
        if (ptVar15 == (type_info *)0x0) {
          if ((p_Var36 == (hashfunc)0x0 & (byte)local_190->field_0x59 >> 1) != 1) {
            pPVar25 = (pPVar25->ob_base).ob_base.ob_type;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1d0,
                       (char *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar25->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)&local_1b0);
            detail::clean_type_id((string *)local_1d0);
            pfVar39 = local_190;
            std::__cxx11::string::_M_append((char *)&local_f0,local_1d0._0_8_);
            if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
              operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
            }
            goto LAB_0010b645;
          }
          local_118._8_8_ = (local_190->scope).m_ptr;
          local_108._0_8_ = "__module__";
          local_108._8_8_ = (inquiry)0x0;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_00);
          local_168._0_8_ = local_168 + 0x10;
          paVar1 = &local_188.field_2;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_168._24_8_ = auStack_1b8;
          }
          else {
            local_168._0_8_ = local_1d0._0_8_;
          }
          local_168._16_8_ = local_1c0;
          local_168._8_8_ = local_1d0._8_8_;
          plVar13 = (long *)std::__cxx11::string::append(local_168);
          puVar26 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_188.field_2._M_allocated_capacity = *puVar26;
            local_188.field_2._8_8_ = plVar13[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar26;
            local_188._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_188._M_string_length = plVar13[1];
          *plVar13 = (long)puVar26;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          local_d0._8_8_ = (pfVar39->scope).m_ptr;
          local_c0 = "__qualname__";
          local_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d0);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_02);
          local_140._0_8_ = local_1d0._0_8_;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_140._24_8_ = auStack_1b8;
            local_140._0_8_ = (PyTypeObject *)(local_140 + 0x10);
          }
          local_140._16_8_ = local_1c0;
          local_140._8_8_ = local_1d0._8_8_;
          uVar31 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            uVar31 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (PySequenceMethods *)(local_188._M_string_length + local_1d0._8_8_)) {
            pPVar32 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
              pPVar32 = (PySequenceMethods *)local_1c0;
            }
            if (pPVar32 < (PySequenceMethods *)(local_188._M_string_length + local_1d0._8_8_))
            goto LAB_0010b44b;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_140,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
          }
          else {
LAB_0010b44b:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_188,local_140._0_8_);
          }
          psVar27 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_1b0.field_2._M_allocated_capacity = *psVar27;
            local_1b0.field_2._8_8_ = puVar14[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar27;
            local_1b0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1b0._M_string_length = puVar14[1];
          *puVar14 = psVar27;
          puVar14[1] = 0;
          *(undefined1 *)psVar27 = 0;
          std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
          }
          object::~object(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          object::~object((object *)(local_108 + 8));
          p_Var36 = (hashfunc)0x0;
        }
        else {
          pPVar25 = ptVar15->type;
          local_108._0_8_ = "__module__";
          local_108._8_8_ = (inquiry)0x0;
          local_118._8_8_ = pPVar25;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle);
          local_168._0_8_ = local_168 + 0x10;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_168._24_8_ = auStack_1b8;
          }
          else {
            local_168._0_8_ = local_1d0._0_8_;
          }
          local_168._16_8_ = local_1c0;
          local_168._8_8_ = local_1d0._8_8_;
          plVar13 = (long *)std::__cxx11::string::append(local_168);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          puVar26 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_188.field_2._M_allocated_capacity = *puVar26;
            local_188.field_2._8_8_ = plVar13[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar26;
            local_188._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_188._M_string_length = plVar13[1];
          *plVar13 = (long)puVar26;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          local_c0 = "__qualname__";
          local_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_d0._8_8_ = pPVar25;
          pdVar16 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d0);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_1d0,pdVar16,handle_01);
          pfVar39 = local_190;
          local_140._0_8_ = local_1d0._0_8_;
          if ((PyTypeObject *)local_1d0._0_8_ == (PyTypeObject *)&local_1c0) {
            local_140._24_8_ = auStack_1b8;
            local_140._0_8_ = (PyTypeObject *)(local_140 + 0x10);
          }
          local_140._16_8_ = local_1c0;
          local_140._8_8_ = local_1d0._8_8_;
          uVar31 = (PySequenceMethods *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            uVar31 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (PySequenceMethods *)(local_188._M_string_length + local_1d0._8_8_)) {
            pPVar32 = (PySequenceMethods *)0xf;
            if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
              pPVar32 = (PySequenceMethods *)local_1c0;
            }
            if (pPVar32 < (PySequenceMethods *)(local_188._M_string_length + local_1d0._8_8_))
            goto LAB_0010b1a6;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_140,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
          }
          else {
LAB_0010b1a6:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_188,local_140._0_8_);
          }
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          psVar27 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_1b0.field_2._M_allocated_capacity = *psVar27;
            local_1b0.field_2._8_8_ = puVar14[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar27;
            local_1b0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1b0._M_string_length = puVar14[1];
          *puVar14 = psVar27;
          puVar14[1] = 0;
          *(undefined1 *)psVar27 = 0;
          std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_140._0_8_ != (PyTypeObject *)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
          }
          object::~object(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          object::~object((object *)(local_108 + 8));
        }
      }
      else {
        if (bVar2 == 0) break;
LAB_0010afb4:
        std::__cxx11::string::push_back((char)&local_f0);
      }
    }
    else if (bVar2 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        if (p_Var36 + pfVar39->nargs_kw_only == local_148 && pfVar39->nargs_kw_only != 0) {
          std::__cxx11::string::append((char *)&local_f0);
        }
        paVar33 = (pfVar39->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((p_Var36 < (hashfunc)
                        ((long)(pfVar39->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar33 >> 5)) &&
            (*(long *)(paVar33 + (long)p_Var36 * 0x20) != 0)) ||
           ((*(ushort *)&pfVar39->field_0x59 & 0x10) != 0 && p_Var36 == (hashfunc)0x0)) {
          std::__cxx11::string::append((char *)&local_f0);
        }
        else {
          uVar38 = (long)p_Var36 - (ulong)((*(ushort *)&pfVar39->field_0x59 >> 4 & 1) != 0);
          cVar30 = '\x01';
          if (9 < uVar38) {
            uVar28 = uVar38;
            cVar8 = '\x04';
            do {
              cVar30 = cVar8;
              if (uVar28 < 100) {
                cVar30 = cVar30 + -2;
                goto LAB_0010b55c;
              }
              if (uVar28 < 1000) {
                cVar30 = cVar30 + -1;
                goto LAB_0010b55c;
              }
              if (uVar28 < 10000) goto LAB_0010b55c;
              bVar6 = 99999 < uVar28;
              uVar28 = uVar28 / 10000;
              cVar8 = cVar30 + '\x04';
            } while (bVar6);
            cVar30 = cVar30 + '\x01';
          }
LAB_0010b55c:
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1b0._M_dataplus._M_p,(uint)local_1b0._M_string_length,uVar38);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x1177c6);
          pfVar39 = local_190;
          local_1d0._0_8_ = &local_1c0;
          pPVar25 = (PyTypeObject *)(plVar13 + 2);
          if ((PyTypeObject *)*plVar13 == pPVar25) {
            local_1c0 = (char *)(pPVar25->ob_base).ob_base.ob_refcnt;
            auStack_1b8 = (undefined1  [8])plVar13[3];
          }
          else {
            local_1c0 = (char *)(pPVar25->ob_base).ob_base.ob_refcnt;
            local_1d0._0_8_ = (PyTypeObject *)*plVar13;
          }
          local_1d0._8_8_ = plVar13[1];
          *plVar13 = (long)pPVar25;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_f0,local_1d0._0_8_);
          if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)&local_1c0) {
            operator_delete((void *)local_1d0._0_8_,(ulong)((long)local_1c0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_f0);
      }
    }
    else {
      if (bVar2 != 0x7d) goto LAB_0010afb4;
      paVar33 = (pfVar39->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((p_Var36 < (hashfunc)
                     ((long)(pfVar39->args).
                            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar33 >> 5)) &&
         (*(long *)(paVar33 + (long)p_Var36 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&local_f0);
        std::__cxx11::string::append((char *)&local_f0);
      }
      p_Var36 = p_Var36 + 1;
      if (p_Var36 == (hashfunc)(ulong)pfVar39->nargs_pos_only && pfVar39->nargs_pos_only != 0) {
        std::__cxx11::string::append((char *)&local_f0);
      }
    }
LAB_0010b645:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((p_Var36 != local_148) || (local_f8[lVar34] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar11 = strdup(local_f0._M_dataplus._M_p);
  pfVar39->signature = pcVar11;
  if ((pfVar39->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pfVar39->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_a0);
  }
  pcVar35 = local_a8;
  pfVar39->nargs = (uint16_t)local_148;
  pPVar21 = (pfVar39->sibling).m_ptr;
  if (pPVar21 == (PyObject *)0x0) {
LAB_0010b7b2:
    pPVar19 = (PyMethodDef *)operator_new(0x20);
    pfVar39->def = pPVar19;
    *(undefined8 *)&pPVar19->ml_flags = 0;
    pPVar19->ml_doc = (char *)0x0;
    pPVar19->ml_name = pfVar39->name;
    pPVar19->ml_meth = dispatcher;
    pPVar19->ml_flags = 3;
    capsule::capsule((capsule *)&local_1b0,pfVar39,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    local_188._M_dataplus._M_p = (pointer)0x0;
    pPVar21 = (pfVar39->scope).m_ptr;
    if (pPVar21 != (PyObject *)0x0) {
      iVar9 = PyObject_HasAttrString(pPVar21,"__module__");
      if (iVar9 == 1) {
        local_1d0._8_8_ = (local_190->scope).m_ptr;
        local_1c0 = "__module__";
        auStack_1b8 = (undefined1  [8])0x0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d0);
      }
      else {
        iVar9 = PyObject_HasAttrString((local_190->scope).m_ptr,"__name__");
        if (iVar9 != 1) goto LAB_0010b8bc;
        local_1d0._8_8_ = (local_190->scope).m_ptr;
        local_1c0 = "__name__";
        auStack_1b8 = (undefined1  [8])0x0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d0);
      }
      local_168._0_8_ = (poVar20->super_handle).m_ptr;
      if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)0x0) {
        (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
             (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
      }
      object::operator=((object *)&local_188,(object *)local_168);
      object::~object((object *)local_168);
      object::~object((object *)auStack_1b8);
    }
LAB_0010b8bc:
    pPVar21 = (PyObject *)
              PyCMethod_New(local_190->def,local_1b0._M_dataplus._M_p,local_188._M_dataplus._M_p,0);
    (pcVar35->super_function).super_object.super_handle.m_ptr = pPVar21;
    if (pPVar21 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_188);
    object::~object((object *)&local_1b0);
    p_Var23 = (descrgetfunc)&local_1c0;
    local_1d0._8_8_ = (PyObject *)0x0;
    local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
    bVar6 = true;
    pfVar17 = local_190;
    local_1d0._0_8_ = p_Var23;
    local_b0 = p_Var23;
  }
  else {
    if (pPVar21->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar21 = (PyObject *)pPVar21[1].ob_refcnt;
      (pfVar39->sibling).m_ptr = pPVar21;
      if (pPVar21 == (PyObject *)0x0) goto LAB_0010b7b2;
    }
    if (pPVar21->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar9 = PyType_IsSubtype(pPVar21->ob_type,&PyCFunction_Type);
      pPVar21 = (pfVar39->sibling).m_ptr;
      if (iVar9 == 0) {
        if ((pPVar21 != (PyObject *)&_Py_NoneStruct) && (*pfVar39->name != '_')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,pfVar39->name,(allocator<char> *)local_168);
          std::operator+(&local_1b0,"Cannot overload existing non-function object \"",&local_188);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_1d0._0_8_ = *plVar13;
          psVar27 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_1d0._0_8_ == psVar27) {
            local_1c0 = (char *)*psVar27;
            auStack_1b8 = (undefined1  [8])plVar13[3];
            local_1d0._0_8_ = &local_1c0;
          }
          else {
            local_1c0 = (char *)*psVar27;
          }
          local_1d0._8_8_ = plVar13[1];
          *plVar13 = (long)psVar27;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          pybind11_fail((string *)local_1d0);
        }
        goto LAB_0010b7b2;
      }
    }
    if ((*(byte *)(pPVar21[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1d0._0_8_ = pPVar21[1].ob_type;
      if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_1d0._0_8_ = (PyTypeObject *)0x0;
    }
    pfVar17 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1d0);
    pPVar21 = (pfVar17->scope).m_ptr;
    pPVar22 = (local_190->scope).m_ptr;
    object::~object((object *)local_1d0);
    pfVar39 = local_190;
    if (pPVar21 != pPVar22) goto LAB_0010b7b2;
    pPVar21 = (local_190->sibling).m_ptr;
    (pcVar35->super_function).super_object.super_handle.m_ptr = pPVar21;
    if (pPVar21 != (PyObject *)0x0) {
      pPVar21->ob_refcnt = pPVar21->ob_refcnt + 1;
    }
    uVar24 = *(ushort *)&local_190->field_0x59;
    if (((*(ushort *)&pfVar17->field_0x59 ^ uVar24) & 0x10) != 0) {
      iVar9 = 0x117d64;
      if ((uVar24 & 0x10) == 0) {
        iVar9 = 0x11793f;
      }
      local_d0._0_8_ = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,iVar9,((uVar24 & 0x10) >> 3) + iVar9 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0)
      ;
      plVar13 = (long *)std::__cxx11::string::append(local_140);
      local_118._0_8_ = *plVar13;
      plVar29 = plVar13 + 2;
      if ((long *)local_118._0_8_ == plVar29) {
        local_108._0_8_ = *plVar29;
        local_108._8_8_ = plVar13[3];
        local_118._0_8_ = local_108;
      }
      else {
        local_108._0_8_ = *plVar29;
      }
      local_118._8_8_ = plVar13[1];
      *plVar13 = (long)plVar29;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_50.obj.m_ptr = (local_190->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_98,&local_50);
      str::operator_cast_to_string(&local_70,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     &local_70);
      plVar13 = (long *)std::__cxx11::string::append(local_168);
      local_188._M_dataplus._M_p = (pointer)*plVar13;
      plVar29 = plVar13 + 2;
      if ((long *)local_188._M_dataplus._M_p == plVar29) {
        local_188.field_2._M_allocated_capacity = *plVar29;
        local_188.field_2._8_8_ = plVar13[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *plVar29;
      }
      local_188._M_string_length = plVar13[1];
      *plVar13 = (long)plVar29;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_190->name,&local_119);
      std::operator+(&local_1b0,&local_188,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     &local_1b0,&local_f0);
      pybind11_fail((string *)local_1d0);
    }
    pfVar5 = pfVar17;
    if ((uVar24 >> 8 & 1) == 0) {
      do {
        pfVar18 = pfVar5;
        pfVar5 = pfVar18->next;
      } while (pfVar5 != (function_record *)0x0);
      pfVar18->next = local_190;
    }
    else {
      local_190->next = pfVar17;
      local_1d0._0_8_ = pPVar21[1].ob_type;
      if ((PyTypeObject *)local_1d0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_1d0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
      iVar9 = PyCapsule_SetPointer(local_1d0._0_8_,local_190);
      if (iVar9 != 0) {
        pybind11_fail("Could not set capsule pointer");
      }
      object::~object((object *)local_1d0);
      pfVar17 = pfVar39;
    }
    p_Var23 = (descrgetfunc)&local_1c0;
    local_1d0._8_8_ = (PyObject *)0x0;
    local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
    local_1d0._0_8_ = p_Var23;
    if (DAT_00121599 == 1) {
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
      p_Var23 = (descrgetfunc)std::__cxx11::string::append(local_1d0);
    }
    if (pfVar17 == (function_record *)0x0) goto LAB_0010bb82;
    bVar6 = false;
  }
  iVar9 = 0;
  local_148 = (hashfunc)CONCAT44(local_148._4_4_,(int)CONCAT71((int7)((ulong)p_Var23 >> 8),1));
  do {
    if (DAT_00121599 == 1) {
      if (0 < iVar9) {
        std::__cxx11::string::append(local_1d0);
      }
      if (!bVar6) {
        uVar37 = iVar9 + 1;
        local_f8 = (type_info **)CONCAT44(local_f8._4_4_,uVar37);
        __val = -uVar37;
        if (0 < (int)uVar37) {
          __val = uVar37;
        }
        __len = 1;
        if (9 < __val) {
          uVar38 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar10 = (uint)uVar38;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0010b9c4;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0010b9c4;
            }
            if (uVar10 < 10000) goto LAB_0010b9c4;
            uVar38 = uVar38 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0010b9c4:
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_188,(char)__len - (char)((int)uVar37 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_188._M_dataplus._M_p + (uVar37 >> 0x1f),__len,__val);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        psVar27 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_1b0.field_2._M_allocated_capacity = *psVar27;
          local_1b0.field_2._8_8_ = puVar14[3];
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar27;
          local_1b0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_1b0._M_string_length = puVar14[1];
        *puVar14 = psVar27;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append(local_1d0,(ulong)local_1b0._M_dataplus._M_p);
        iVar9 = (int)local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
      std::__cxx11::string::append(local_1d0);
    }
    if (((pfVar17->doc != (char *)0x0) && (*pfVar17->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_00121599 | (byte)local_148) & 1) == 0) {
        std::__cxx11::string::append(local_1d0);
        local_148 = (hashfunc)((ulong)local_148 & 0xffffffff00000000);
      }
      else {
        local_148 = (hashfunc)
                    CONCAT44(local_148._4_4_,
                             CONCAT31((int3)((ulong)local_148 >> 8),(byte)local_148 & DAT_00121599))
        ;
      }
      if ((DAT_00121599 & 1) != 0) {
        std::__cxx11::string::append(local_1d0);
      }
      std::__cxx11::string::append(local_1d0);
      if (DAT_00121599 == 1) {
        std::__cxx11::string::append(local_1d0);
      }
    }
    pfVar17 = pfVar17->next;
    pcVar35 = local_a8;
    pfVar39 = local_190;
  } while (pfVar17 != (function_record *)0x0);
LAB_0010bb82:
  pPVar21 = (pcVar35->super_function).super_object.super_handle.m_ptr;
  lVar34 = pPVar21[1].ob_refcnt;
  if (*(void **)(lVar34 + 0x18) != (void *)0x0) {
    free(*(void **)(lVar34 + 0x18));
    lVar34 = pPVar21[1].ob_refcnt;
  }
  pcVar11 = strdup((char *)local_1d0._0_8_);
  p_Var23 = local_b0;
  *(char **)(lVar34 + 0x18) = pcVar11;
  if ((pfVar39->field_0x59 & 0x10) != 0) {
    pPVar22 = (PyObject *)
              PyInstanceMethod_New((pcVar35->super_function).super_object.super_handle.m_ptr);
    (pcVar35->super_function).super_object.super_handle.m_ptr = pPVar22;
    if (pPVar22 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar21->ob_refcnt = pPVar21->ob_refcnt + -1;
    if (pPVar21->ob_refcnt == 0) {
      _Py_Dealloc(pPVar21);
    }
  }
  if ((descrgetfunc)local_1d0._0_8_ != p_Var23) {
    operator_delete((void *)local_1d0._0_8_,(long)local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(rec);
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = rec;
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }